

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O2

void R_DrawTiltedPlane(visplane_t *pl,double _xscale,double _yscale,fixed_t alpha,bool additive,
                      bool masked)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  lighttable_t *plVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  double dVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  DVector2 local_78;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (alpha < 1) {
    return;
  }
  fVar1 = R_DrawTiltedPlane::ifloatpow2[ds_xbits];
  fVar2 = R_DrawTiltedPlane::ifloatpow2[ds_ybits];
  dVar6 = 64.0 / ((double)fVar1 * _xscale);
  dVar8 = 64.0 / ((double)fVar2 * _yscale);
  local_78.X = ViewPos.X;
  local_78.Y = ViewPos.Y;
  dVar5 = secplane_t::ZatPoint(&pl->height,&local_78);
  pviewx = SUB84(6755399441055744.0 / (double)(1 << (-(char)ds_xbits & 0x1fU)) +
                 (pl->xform).xScale * (pl->xform).xOffs,0);
  pviewy = SUB84(6755399441055744.0 / (double)(1 << (-(char)ds_ybits & 0x1fU)) +
                 (pl->xform).yScale * (pl->xform).yOffs,0);
  dVar7 = ((pl->xform).Angle.Degrees + (pl->xform).baseAngle.Degrees) * 0.017453292519943295;
  dVar17 = ViewAngle.Degrees * 0.017453292519943295;
  sincos(4.71238898038469 - dVar17,&local_38,&local_40);
  dVar3 = (pl->height).D;
  dVar4 = (pl->height).negiC;
  fVar12 = (float)(dVar4 * dVar3 - ViewPos.Z);
  sincos(3.141592653589793 - (dVar17 + dVar7),&local_58,&local_60);
  fVar13 = (float)(local_58 * dVar8);
  fVar14 = (float)(-dVar6 * local_60);
  sincos(dVar7,&local_48,&local_50);
  dVar7 = (pl->height).normal.X;
  dVar17 = (pl->height).normal.Y;
  fVar15 = (float)(ViewPos.Y * local_40 + local_38 * ViewPos.X);
  fVar16 = (float)(ViewPos.X * local_40 - local_38 * ViewPos.Y);
  fVar18 = (float)(dVar8 * local_60);
  fVar19 = (float)(((dVar8 * local_50 + ViewPos.Y) * dVar17 +
                   (dVar8 * local_48 + ViewPos.X) * dVar7 + dVar3) * dVar4 - dVar5);
  plane_su.X = fVar12 * fVar13 - fVar19 * fVar15;
  fVar20 = (float)(dVar6 * local_58);
  fVar21 = (float)(dVar5 - ((dVar6 * local_48 + ViewPos.Y) * dVar17 +
                           dVar3 + (ViewPos.X - dVar6 * local_50) * dVar7) * dVar4);
  plane_su.Y = (float)((double)(fVar18 * fVar15 - fVar16 * fVar13) * IYaspectMul);
  plane_su.Z = (float)((double)(fVar19 * fVar16 - fVar12 * fVar18) * FocalLengthX);
  plane_sv.X = fVar12 * fVar14 - fVar21 * fVar15;
  plane_sz.X = fVar19 * fVar14 - fVar21 * fVar13;
  plane_sv.Z = (float)((double)(fVar16 * fVar21 - fVar12 * fVar20) * FocalLengthX);
  plane_sv.Y = (float)((double)(fVar15 * fVar20 - fVar16 * fVar14) * IYaspectMul);
  plane_sz.Z = (float)((double)(fVar18 * fVar21 - fVar20 * fVar19) * FocalLengthX);
  plane_sz.Y = (float)((double)(fVar13 * fVar20 - fVar14 * fVar18) * IYaspectMul);
  TVector3<float>::operator*=(&plane_su,4.2949673e+09);
  TVector3<float>::operator*=(&plane_sv,4.2949673e+09);
  if (((byte)MirrorFlags & 1) != 0) {
    plane_su.X = -plane_su.X;
    plane_sv.X = -plane_sv.X;
    plane_sz.X = -plane_sz.X;
  }
  dVar3 = (double)r_TiltVisibility;
  local_78.X = ViewPos.X;
  local_78.Y = ViewPos.Y;
  dVar4 = secplane_t::ZatPoint(&pl->height,&local_78);
  planelightfloat =
       (float)(((double)fVar2 * _yscale * dVar3 * (double)fVar1 * _xscale * 1.52587890625e-05) /
              ABS(dVar4 - ViewPos.Z));
  if (0.0 < (pl->height).normal.Z) {
    planelightfloat = -planelightfloat;
  }
  if ((long)fixedlightlev < 0) {
    plVar9 = fixedcolormap;
    if (fixedcolormap == (lighttable_t *)0x0) {
      ds_colormap = basecolormap->Maps;
      plane_shade = true;
      goto LAB_0033024e;
    }
  }
  else {
    plVar9 = basecolormap->Maps + fixedlightlev;
  }
  plane_shade = false;
  uVar11 = 0;
  uVar10 = (ulong)(uint)viewwidth;
  if (viewwidth < 1) {
    uVar10 = uVar11;
  }
  ds_colormap = plVar9;
  for (; uVar10 * 8 != uVar11; uVar11 = uVar11 + 8) {
    *(lighttable_t **)((long)tiltlighting + uVar11) = plVar9;
  }
LAB_0033024e:
  R_MapVisPlane(pl,R_MapTiltedPlane);
  return;
}

Assistant:

void R_DrawTiltedPlane (visplane_t *pl, double _xscale, double _yscale, fixed_t alpha, bool additive, bool masked)
{
	static const float ifloatpow2[16] =
	{
		// ifloatpow2[i] = 1 / (1 << i)
		64.f, 32.f, 16.f, 8.f, 4.f, 2.f, 1.f, 0.5f,
		0.25f, 0.125f, 0.0625f, 0.03125f, 0.015625f, 0.0078125f,
		0.00390625f, 0.001953125f
		/*, 0.0009765625f, 0.00048828125f, 0.000244140625f,
		1.220703125e-4f, 6.103515625e-5, 3.0517578125e-5*/
	};
	double lxscale, lyscale;
	double xscale, yscale;
	FVector3 p, m, n;
	double ang, planeang, cosine, sine;
	double zeroheight;

	if (alpha <= 0)
	{
		return;
	}

	lxscale = _xscale * ifloatpow2[ds_xbits];
	lyscale = _yscale * ifloatpow2[ds_ybits];
	xscale = 64.f / lxscale;
	yscale = 64.f / lyscale;
	zeroheight = pl->height.ZatPoint(ViewPos);

	pviewx = xs_ToFixed(32 - ds_xbits, pl->xform.xOffs * pl->xform.xScale);
	pviewy = xs_ToFixed(32 - ds_ybits, pl->xform.yOffs * pl->xform.yScale);
	planeang = (pl->xform.Angle + pl->xform.baseAngle).Radians();

	// p is the texture origin in view space
	// Don't add in the offsets at this stage, because doing so can result in
	// errors if the flat is rotated.
	ang = M_PI*3/2 - ViewAngle.Radians();
	cosine = cos(ang), sine = sin(ang);
	p[0] = ViewPos.X * cosine - ViewPos.Y * sine;
	p[2] = ViewPos.X * sine + ViewPos.Y * cosine;
	p[1] = pl->height.ZatPoint(0.0, 0.0) - ViewPos.Z;

	// m is the v direction vector in view space
	ang = ang - M_PI / 2 - planeang;
	cosine = cos(ang), sine = sin(ang);
	m[0] = yscale * cosine;
	m[2] = yscale * sine;
//	m[1] = pl->height.ZatPointF (0, iyscale) - pl->height.ZatPointF (0,0));
//	VectorScale2 (m, 64.f/VectorLength(m));

	// n is the u direction vector in view space
#if 0
	//let's use the sin/cosine we already know instead of computing new ones
	ang += M_PI/2
	n[0] = -xscale * cos(ang);
	n[2] = -xscale * sin(ang);
#else
	n[0] = xscale * sine;
	n[2] = -xscale * cosine;
#endif
//	n[1] = pl->height.ZatPointF (ixscale, 0) - pl->height.ZatPointF (0,0));
//	VectorScale2 (n, 64.f/VectorLength(n));

	// This code keeps the texture coordinates constant across the x,y plane no matter
	// how much you slope the surface. Use the commented-out code above instead to keep
	// the textures a constant size across the surface's plane instead.
	cosine = cos(planeang), sine = sin(planeang);
	m[1] = pl->height.ZatPoint(ViewPos.X + yscale * sine, ViewPos.Y + yscale * cosine) - zeroheight;
	n[1] = -(pl->height.ZatPoint(ViewPos.X - xscale * cosine, ViewPos.Y + xscale * sine) - zeroheight);

	plane_su = p ^ m;
	plane_sv = p ^ n;
	plane_sz = m ^ n;

	plane_su.Z *= FocalLengthX;
	plane_sv.Z *= FocalLengthX;
	plane_sz.Z *= FocalLengthX;

	plane_su.Y *= IYaspectMul;
	plane_sv.Y *= IYaspectMul;
	plane_sz.Y *= IYaspectMul;

	// Premultiply the texture vectors with the scale factors
	plane_su *= 4294967296.f;
	plane_sv *= 4294967296.f;

	if (MirrorFlags & RF_XFLIP)
	{
		plane_su[0] = -plane_su[0];
		plane_sv[0] = -plane_sv[0];
		plane_sz[0] = -plane_sz[0];
	}

	planelightfloat = (r_TiltVisibility * lxscale * lyscale) / (fabs(pl->height.ZatPoint(ViewPos) - ViewPos.Z)) / 65536.f;

	if (pl->height.fC() > 0)
		planelightfloat = -planelightfloat;

	if (fixedlightlev >= 0)
		ds_colormap = basecolormap->Maps + fixedlightlev, plane_shade = false;
	else if (fixedcolormap)
		ds_colormap = fixedcolormap, plane_shade = false;
	else
		ds_colormap = basecolormap->Maps, plane_shade = true;

	if (!plane_shade)
	{
		for (int i = 0; i < viewwidth; ++i)
		{
			tiltlighting[i] = ds_colormap;
		}
	}

#if defined(X86_ASM)
	if (ds_source != ds_curtiltedsource)
		R_SetTiltedSpanSource_ASM (ds_source);
	R_MapVisPlane (pl, R_DrawTiltedPlane_ASM);
#else
	R_MapVisPlane (pl, R_MapTiltedPlane);
#endif
}